

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

bool spirv_cross::opcode_is_sign_invariant(Op opcode)

{
  if (((0x2b < opcode - OpIAdd) || ((0xc0000000015U >> ((ulong)(opcode - OpIAdd) & 0x3f) & 1) == 0))
     && (3 < opcode - OpShiftLeftLogical)) {
    return false;
  }
  return true;
}

Assistant:

static inline bool opcode_is_sign_invariant(spv::Op opcode)
{
	switch (opcode)
	{
	case spv::OpIEqual:
	case spv::OpINotEqual:
	case spv::OpISub:
	case spv::OpIAdd:
	case spv::OpIMul:
	case spv::OpShiftLeftLogical:
	case spv::OpBitwiseOr:
	case spv::OpBitwiseXor:
	case spv::OpBitwiseAnd:
		return true;

	default:
		return false;
	}
}